

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext_api.cc
# Opt level: O2

int GetLabels(void *hPtr,char ***labels)

{
  size_type sVar1;
  uint uVar2;
  char **ppcVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  shared_ptr<const_fasttext::Dictionary> dict;
  string label;
  
  fasttext::FastText::getDictionary((FastText *)&dict);
  uVar2 = fasttext::Dictionary::nlabels
                    (dict.super___shared_ptr<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
  uVar5 = 0xffffffffffffffff;
  if (0 < (int)uVar2) {
    uVar5 = (ulong)uVar2 << 3;
  }
  ppcVar3 = (char **)operator_new__(uVar5);
  *ppcVar3 = (char *)0x0;
  uVar6 = 0;
  memset(ppcVar3 + 1,0,uVar5 - 8);
  uVar5 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar5 = uVar6;
  }
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    fasttext::Dictionary::getLabel_abi_cxx11_
              (&label,dict.
                      super___shared_ptr<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,(int32_t)uVar6);
    sVar1 = label._M_string_length;
    pcVar4 = (char *)operator_new__(label._M_string_length + 1);
    ppcVar3[uVar6] = pcVar4;
    std::__cxx11::string::copy((char *)&label,(ulong)pcVar4,sVar1);
    pcVar4[sVar1] = '\0';
    std::__cxx11::string::~string((string *)&label);
  }
  *labels = ppcVar3;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&dict.super___shared_ptr<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return uVar2;
}

Assistant:

GetLabels(void* hPtr, char*** labels)
{
    auto fastText = static_cast<FastTextWrapper*>(hPtr);
    auto dict = fastText->getDictionary();
    int numLabels = dict->nlabels();
    auto localLabels = new char*[numLabels] {nullptr};

    for (int i = 0; i < numLabels; ++i)
    {
        auto label = dict->getLabel(i);
        auto len = label.length();
        localLabels[i] = new char[len + 1];
        label.copy(localLabels[i], len);
        localLabels[i][len] = '\0';
    }

    *labels = localLabels;
    return numLabels;
}